

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O0

CEPlanet * CEPlanet::Neptune(void)

{
  CEPlanet *in_RDI;
  CEPlanet *neptune;
  CEPlanet *angle;
  CEPlanet *this;
  uint in_stack_ffffffffffffff80;
  CEAngle *ycoord;
  CEAngle *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  CEPlanet *this_00;
  undefined1 local_31 [40];
  undefined1 local_9;
  
  local_9 = CIRS;
  this = (CEPlanet *)local_31;
  angle = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_31 + 1),"Neptune",(allocator *)this);
  this_00 = (CEPlanet *)0x0;
  CEAngle::CEAngle((CEAngle *)this,(double *)angle);
  ycoord = (CEAngle *)0x0;
  CEAngle::CEAngle((CEAngle *)this,(double *)angle);
  CEPlanet(this_00,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,ycoord,
           (CESkyCoordType *)(ulong)in_stack_ffffffffffffff80);
  CEAngle::~CEAngle((CEAngle *)0x160561);
  CEAngle::~CEAngle((CEAngle *)0x16056b);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  SetSemiMajorAxis_AU(this,(double)angle,(double)in_RDI);
  SetEccentricity(in_RDI,0.00895439,8.18e-06);
  SetInclination(in_RDI,1.7700552,0.000224,DEGREES);
  SetMeanLongitude(in_RDI,304.22289287,218.46515314,DEGREES);
  SetPerihelionLongitude(in_RDI,46.68158724,0.01009938,DEGREES);
  SetAscendingNodeLongitude(in_RDI,131.78635853,-0.00606302,DEGREES);
  SetExtraTerms(in_RDI,-0.00041348,0.68346318,-0.10162547,7.67025);
  SetMeanRadius_m(in_RDI,24624000.0);
  SetAlbedo(in_RDI,0.41);
  SetMass_kg(in_RDI,1.0241e+26);
  SetSofaID(this,(double *)angle);
  return angle;
}

Assistant:

CEPlanet CEPlanet::Neptune()
{
    CEPlanet neptune("Neptune", 0.0, 0.0) ;
    neptune.SetSemiMajorAxis_AU(30.06952752, 0.00006447) ;
    neptune.SetEccentricity(0.00895439, 0.00000818) ;
    neptune.SetInclination(1.77005520, 0.00022400, CEAngleType::DEGREES) ;
    neptune.SetMeanLongitude(304.22289287, 218.46515314, CEAngleType::DEGREES) ;
    neptune.SetPerihelionLongitude(46.68158724, 0.01009938, CEAngleType::DEGREES) ;
    neptune.SetAscendingNodeLongitude(131.78635853, -0.00606302, CEAngleType::DEGREES) ;
    
    neptune.SetExtraTerms(-0.00041348, 0.68346318, -0.10162547, 7.67025000) ;
    
    // Set planetary properties
    neptune.SetMeanRadius_m(24624000.0) ;
    neptune.SetAlbedo(0.41) ;
    neptune.SetMass_kg(1.0241E26) ;
    
    // Set the sofa planet ID
    neptune.SetSofaID(8) ;
    
    return neptune ;
}